

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  short sVar1;
  int *piVar6;
  short sVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  uint uVar16;
  int iVar17;
  parasail_result_t *ppVar18;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  char *pcVar22;
  uint uVar23;
  long lVar24;
  uint uVar25;
  undefined8 unaff_RBX;
  ulong uVar26;
  int16_t iVar27;
  uint uVar28;
  uint uVar30;
  ulong uVar31;
  char *__format;
  uint uVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  short sVar37;
  undefined4 uVar38;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined4 uVar39;
  undefined1 auVar42 [16];
  short sVar44;
  short sVar50;
  undefined1 auVar43 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ushort uVar53;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  undefined1 auVar54 [16];
  ushort uVar63;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int16_t *local_120;
  undefined1 local_118 [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  short local_c8;
  short sStack_c6;
  undefined1 local_b8 [16];
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  uint local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  int iVar29;
  short sVar64;
  short sVar66;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar22 = "_s2";
  }
  else {
    uVar21 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar22 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar22 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar22 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar22 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
LAB_0061fd68:
        iVar17 = matrix->min;
        iVar29 = -iVar17;
        if (iVar17 != -open && SBORROW4(iVar17,-open) == iVar17 + open < 0) {
          iVar29 = open;
        }
        uVar28 = iVar29 - 0x7fff;
        iVar17 = matrix->max;
        auVar40 = pshuflw(ZEXT416(uVar28),ZEXT416(uVar28),0);
        uVar38 = auVar40._0_4_;
        local_78._4_4_ = uVar38;
        local_78._0_4_ = uVar38;
        local_78._8_4_ = uVar38;
        local_78._12_4_ = uVar38;
        local_c8 = auVar40._0_2_;
        sStack_c6 = auVar40._2_2_;
        local_b8._4_4_ = uVar38;
        local_b8._0_4_ = uVar38;
        local_b8._8_4_ = uVar38;
        local_b8._12_4_ = uVar38;
        ppVar18 = parasail_result_new();
        if (ppVar18 != (parasail_result_t *)0x0) {
          ppVar18->flag = ppVar18->flag | 0x8201004;
          uVar31 = (ulong)(s2Len + 0xe);
          local_a8 = gap;
          local_98 = open;
          ptr = parasail_memalign_int16_t(0x10,uVar31);
          ptr_00 = parasail_memalign_int16_t(0x10,uVar31);
          ptr_01 = parasail_memalign_int16_t(0x10,uVar31);
          if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
            lVar19 = (long)_s1Len;
            if (matrix->type == 0) {
              local_120 = parasail_memalign_int16_t(0x10,(long)(int)(_s1Len + 7));
              uVar31 = 0;
              if (local_120 == (int16_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              uVar26 = 0;
              if (0 < _s1Len) {
                uVar26 = (ulong)(uint)_s1Len;
              }
              for (; lVar24 = lVar19, uVar26 != uVar31; uVar31 = uVar31 + 1) {
                local_120[uVar31] = (int16_t)matrix->mapper[(byte)_s1[uVar31]];
              }
              for (; lVar24 < (int)(_s1Len + 7); lVar24 = lVar24 + 1) {
                local_120[lVar24] = 0;
              }
            }
            else {
              local_120 = (int16_t *)0x0;
            }
            uVar16 = s2Len + 7;
            auVar40 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_RBX >> 0x10),0x7ffe - (short)iVar17
                                            ));
            auVar41 = pshuflw(auVar40,auVar40,0);
            local_68 = auVar41._0_2_;
            sStack_66 = auVar41._2_2_;
            auVar40._4_2_ = local_c8;
            auVar40._0_4_ = uVar38;
            auVar40._6_2_ = sStack_c6;
            auVar40._8_2_ = local_c8;
            auVar40._10_2_ = sStack_c6;
            auVar40._12_2_ = local_c8;
            auVar40._14_2_ = sStack_c6;
            local_48 = pblendw((undefined1  [16])0x0,auVar40,0x7f);
            auVar40 = pshuflw(ZEXT416(local_98),ZEXT416(local_98),0);
            local_98 = auVar40._0_4_;
            uStack_94 = local_98;
            uStack_90 = local_98;
            uStack_8c = local_98;
            auVar40 = pshuflw(ZEXT416(local_a8),ZEXT416(local_a8),0);
            uVar39 = auVar40._0_4_;
            auVar40 = pshuflw(ZEXT416((uint)_s1Len),ZEXT416((uint)_s1Len),0);
            local_58 = auVar40._0_4_;
            uVar15 = local_58;
            uStack_54 = local_58;
            uStack_50 = local_58;
            uStack_4c = local_58;
            auVar42 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
            local_a8 = auVar42._0_4_;
            uVar14 = local_a8;
            uStack_a4 = local_a8;
            uStack_a0 = local_a8;
            uStack_9c = local_a8;
            piVar6 = matrix->mapper;
            for (uVar31 = 0; uVar21 != uVar31; uVar31 = uVar31 + 1) {
              ptr[uVar31 + 7] = (int16_t)piVar6[(byte)_s2[uVar31]];
            }
            for (lVar24 = 0; uVar31 = uVar21, lVar24 != 7; lVar24 = lVar24 + 1) {
              ptr[lVar24] = 0;
            }
            for (; (int)uVar31 < (int)uVar16; uVar31 = uVar31 + 1) {
              ptr[uVar31 + 7] = 0;
            }
            for (uVar31 = 0; iVar27 = (int16_t)uVar28, uVar21 != uVar31; uVar31 = uVar31 + 1) {
              ptr_00[uVar31 + 7] = 0;
              ptr_01[uVar31 + 7] = iVar27;
            }
            for (lVar24 = 0; lVar24 != 7; lVar24 = lVar24 + 1) {
              ptr_00[lVar24] = iVar27;
              ptr_01[lVar24] = iVar27;
            }
            for (; (int)uVar21 < (int)uVar16; uVar21 = uVar21 + 1) {
              ptr_00[uVar21 + 7] = iVar27;
              ptr_01[uVar21 + 7] = iVar27;
            }
            uVar20 = _s1Len - 1;
            uVar31 = 0;
            uVar21 = (ulong)uVar16;
            if ((int)uVar16 < 1) {
              uVar21 = uVar31;
            }
            local_118._8_8_ = 0x100020003;
            local_118._0_8_ = 0x4000500060007;
            local_88._4_2_ = local_c8;
            local_88._0_4_ = uVar38;
            local_88._6_2_ = sStack_c6;
            local_88._8_2_ = local_c8;
            local_88._10_2_ = sStack_c6;
            local_88._12_2_ = local_c8;
            local_88._14_2_ = sStack_c6;
            local_e8 = CONCAT26(sStack_66,CONCAT24(local_68,auVar41._0_4_));
            uStack_e0 = CONCAT26(sStack_66,CONCAT24(local_68,auVar41._0_4_));
            local_d8 = local_88;
            for (; (long)uVar31 < lVar19; uVar31 = uVar31 + 8) {
              if (matrix->type == 0) {
                uVar16 = (uint)local_120[uVar31];
                uVar32 = (uint)local_120[uVar31 + 1];
                uVar34 = (uint)local_120[uVar31 + 2];
                uVar30 = (uint)local_120[uVar31 + 3];
                uVar35 = (uint)local_120[uVar31 + 4];
                uVar23 = (uint)local_120[uVar31 + 5];
                uVar36 = (uint)local_120[uVar31 + 6];
                uVar25 = (int)local_120[uVar31 + 7];
              }
              else {
                uVar16 = (uint)uVar31;
                uVar32 = uVar16 | 1;
                if (lVar19 <= (long)(uVar31 | 1)) {
                  uVar32 = uVar20;
                }
                uVar34 = uVar16 | 2;
                if (lVar19 <= (long)(uVar31 | 2)) {
                  uVar34 = uVar20;
                }
                uVar30 = uVar16 | 3;
                if (lVar19 <= (long)(uVar31 | 3)) {
                  uVar30 = uVar20;
                }
                uVar35 = uVar16 | 4;
                if (lVar19 <= (long)(uVar31 | 4)) {
                  uVar35 = uVar20;
                }
                uVar23 = uVar16 | 5;
                if (lVar19 <= (long)(uVar31 | 5)) {
                  uVar23 = uVar20;
                }
                uVar36 = uVar16 | 6;
                if (lVar19 <= (long)(uVar31 | 6)) {
                  uVar36 = uVar20;
                }
                uVar25 = uVar16 | 7;
                if (lVar19 <= (long)(uVar31 | 7)) {
                  uVar25 = uVar20;
                }
              }
              piVar6 = matrix->matrix;
              iVar17 = matrix->size;
              local_58._0_2_ = auVar40._0_2_;
              local_58._2_2_ = auVar40._2_2_;
              auVar67._0_2_ = -(ushort)((short)local_118._0_2_ < (short)local_58);
              auVar67._2_2_ = -(ushort)((short)local_118._2_2_ < local_58._2_2_);
              auVar67._4_2_ = -(ushort)((short)local_118._4_2_ < (short)local_58);
              auVar67._6_2_ = -(ushort)((short)local_118._6_2_ < local_58._2_2_);
              auVar67._8_2_ = -(ushort)((short)local_118._8_2_ < (short)local_58);
              auVar67._10_2_ = -(ushort)((short)local_118._10_2_ < local_58._2_2_);
              auVar67._12_2_ = -(ushort)((short)local_118._12_2_ < (short)local_58);
              auVar67._14_2_ = -(ushort)((short)local_118._14_2_ < local_58._2_2_);
              uVar26 = 0;
              auVar41._4_2_ = local_c8;
              auVar41._0_4_ = uVar38;
              auVar41._6_2_ = sStack_c6;
              auVar41._8_2_ = local_c8;
              auVar41._10_2_ = sStack_c6;
              auVar41._12_2_ = local_c8;
              auVar41._14_2_ = sStack_c6;
              in_XMM10 = pmovsxbw(in_XMM10,0xfffefdfcfbfaf9);
              auVar72 = local_48;
              auVar71 = local_48;
              auVar75 = auVar41;
              for (; uVar21 != uVar26; uVar26 = uVar26 + 1) {
                auVar51._10_2_ = (short)piVar6[(long)(int)(uVar34 * iVar17) + (long)ptr[uVar26 + 5]]
                ;
                auVar51._8_2_ = (short)piVar6[(long)(int)(uVar30 * iVar17) + (long)ptr[uVar26 + 4]];
                auVar51._12_2_ = (short)piVar6[(long)(int)(uVar32 * iVar17) + (long)ptr[uVar26 + 6]]
                ;
                auVar51._14_2_ = (short)piVar6[(long)(int)(uVar16 * iVar17) + (long)ptr[uVar26 + 7]]
                ;
                auVar51._0_8_ =
                     (ulong)(uint)piVar6[(long)(int)(uVar25 * iVar17) + (long)ptr[uVar26]] &
                     0xffffffff0000ffff |
                     (ulong)*(ushort *)
                             (piVar6 + (long)(int)(uVar36 * iVar17) + (long)ptr[uVar26 + 1]) << 0x10
                     | (ulong)*(ushort *)
                               (piVar6 + (long)(int)(uVar23 * iVar17) + (long)ptr[uVar26 + 2]) <<
                       0x20 | (ulong)*(ushort *)
                                      (piVar6 + (long)(int)(uVar35 * iVar17) + (long)ptr[uVar26 + 3]
                                      ) << 0x30;
                auVar68._0_8_ = auVar71._2_8_;
                auVar68._8_8_ = auVar71._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar26 + 7] << 0x30;
                auVar74._0_8_ = auVar75._2_8_;
                auVar74._8_8_ = auVar75._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar26 + 7] << 0x30;
                auVar73._4_4_ = local_98;
                auVar73._0_4_ = local_98;
                auVar73._8_4_ = local_98;
                auVar73._12_4_ = local_98;
                auVar54 = psubsw(auVar68,auVar73);
                auVar75._4_4_ = uVar39;
                auVar75._0_4_ = uVar39;
                auVar75._8_4_ = uVar39;
                auVar75._12_4_ = uVar39;
                auVar75 = psubsw(auVar74,auVar75);
                sVar7 = auVar54._0_2_;
                sVar64 = auVar75._0_2_;
                auVar76._0_2_ =
                     (ushort)(sVar64 < sVar7) * sVar7 | (ushort)(sVar64 >= sVar7) * sVar64;
                sVar7 = auVar54._2_2_;
                sVar64 = auVar75._2_2_;
                auVar76._2_2_ =
                     (ushort)(sVar64 < sVar7) * sVar7 | (ushort)(sVar64 >= sVar7) * sVar64;
                sVar7 = auVar54._4_2_;
                sVar64 = auVar75._4_2_;
                auVar76._4_2_ =
                     (ushort)(sVar64 < sVar7) * sVar7 | (ushort)(sVar64 >= sVar7) * sVar64;
                sVar7 = auVar54._6_2_;
                sVar64 = auVar75._6_2_;
                auVar76._6_2_ =
                     (ushort)(sVar64 < sVar7) * sVar7 | (ushort)(sVar64 >= sVar7) * sVar64;
                sVar7 = auVar54._8_2_;
                sVar64 = auVar75._8_2_;
                auVar76._8_2_ =
                     (ushort)(sVar64 < sVar7) * sVar7 | (ushort)(sVar64 >= sVar7) * sVar64;
                sVar7 = auVar54._10_2_;
                sVar64 = auVar75._10_2_;
                auVar76._10_2_ =
                     (ushort)(sVar64 < sVar7) * sVar7 | (ushort)(sVar64 >= sVar7) * sVar64;
                sVar7 = auVar54._12_2_;
                sVar64 = auVar75._12_2_;
                sVar66 = auVar75._14_2_;
                auVar76._12_2_ =
                     (ushort)(sVar64 < sVar7) * sVar7 | (ushort)(sVar64 >= sVar7) * sVar64;
                sVar7 = auVar54._14_2_;
                auVar76._14_2_ =
                     (ushort)(sVar66 < sVar7) * sVar7 | (ushort)(sVar66 >= sVar7) * sVar66;
                auVar75 = psubsw(auVar71,auVar73);
                auVar71._4_4_ = uVar39;
                auVar71._0_4_ = uVar39;
                auVar71._8_4_ = uVar39;
                auVar71._12_4_ = uVar39;
                auVar41 = psubsw(auVar41,auVar71);
                sVar7 = auVar75._0_2_;
                sVar64 = auVar41._0_2_;
                auVar65._0_2_ =
                     (ushort)(sVar64 < sVar7) * sVar7 | (ushort)(sVar64 >= sVar7) * sVar64;
                sVar7 = auVar75._2_2_;
                sVar64 = auVar41._2_2_;
                auVar65._2_2_ =
                     (ushort)(sVar64 < sVar7) * sVar7 | (ushort)(sVar64 >= sVar7) * sVar64;
                sVar7 = auVar75._4_2_;
                sVar64 = auVar41._4_2_;
                auVar65._4_2_ =
                     (ushort)(sVar64 < sVar7) * sVar7 | (ushort)(sVar64 >= sVar7) * sVar64;
                sVar7 = auVar75._6_2_;
                sVar64 = auVar41._6_2_;
                auVar65._6_2_ =
                     (ushort)(sVar64 < sVar7) * sVar7 | (ushort)(sVar64 >= sVar7) * sVar64;
                sVar7 = auVar75._8_2_;
                sVar64 = auVar41._8_2_;
                auVar65._8_2_ =
                     (ushort)(sVar64 < sVar7) * sVar7 | (ushort)(sVar64 >= sVar7) * sVar64;
                sVar7 = auVar75._10_2_;
                sVar64 = auVar41._10_2_;
                auVar65._10_2_ =
                     (ushort)(sVar64 < sVar7) * sVar7 | (ushort)(sVar64 >= sVar7) * sVar64;
                sVar7 = auVar75._12_2_;
                sVar64 = auVar41._12_2_;
                sVar66 = auVar41._14_2_;
                auVar65._12_2_ =
                     (ushort)(sVar64 < sVar7) * sVar7 | (ushort)(sVar64 >= sVar7) * sVar64;
                sVar7 = auVar75._14_2_;
                auVar65._14_2_ =
                     (ushort)(sVar66 < sVar7) * sVar7 | (ushort)(sVar66 >= sVar7) * sVar66;
                auVar41 = paddsw(auVar72,auVar51);
                uVar53 = ((short)auVar65._0_2_ < (short)auVar76._0_2_) * auVar76._0_2_ |
                         ((short)auVar65._0_2_ >= (short)auVar76._0_2_) * auVar65._0_2_;
                uVar57 = ((short)auVar65._2_2_ < (short)auVar76._2_2_) * auVar76._2_2_ |
                         ((short)auVar65._2_2_ >= (short)auVar76._2_2_) * auVar65._2_2_;
                uVar58 = ((short)auVar65._4_2_ < (short)auVar76._4_2_) * auVar76._4_2_ |
                         ((short)auVar65._4_2_ >= (short)auVar76._4_2_) * auVar65._4_2_;
                uVar59 = ((short)auVar65._6_2_ < (short)auVar76._6_2_) * auVar76._6_2_ |
                         ((short)auVar65._6_2_ >= (short)auVar76._6_2_) * auVar65._6_2_;
                uVar60 = ((short)auVar65._8_2_ < (short)auVar76._8_2_) * auVar76._8_2_ |
                         ((short)auVar65._8_2_ >= (short)auVar76._8_2_) * auVar65._8_2_;
                uVar61 = ((short)auVar65._10_2_ < (short)auVar76._10_2_) * auVar76._10_2_ |
                         ((short)auVar65._10_2_ >= (short)auVar76._10_2_) * auVar65._10_2_;
                uVar62 = ((short)auVar65._12_2_ < (short)auVar76._12_2_) * auVar76._12_2_ |
                         ((short)auVar65._12_2_ >= (short)auVar76._12_2_) * auVar65._12_2_;
                uVar63 = ((short)auVar65._14_2_ < (short)auVar76._14_2_) * auVar76._14_2_ |
                         ((short)auVar65._14_2_ >= (short)auVar76._14_2_) * auVar65._14_2_;
                sVar64 = (-1 < (short)uVar53) * uVar53;
                sVar7 = (-1 < (short)uVar57) * uVar57;
                sVar66 = (-1 < (short)uVar58) * uVar58;
                sVar1 = (-1 < (short)uVar59) * uVar59;
                sVar2 = (-1 < (short)uVar60) * uVar60;
                sVar3 = (-1 < (short)uVar61) * uVar61;
                sVar4 = (-1 < (short)uVar62) * uVar62;
                sVar5 = (-1 < (short)uVar63) * uVar63;
                sVar37 = auVar41._0_2_;
                auVar55._0_2_ =
                     (ushort)(sVar64 < sVar37) * sVar37 | (ushort)(sVar64 >= sVar37) * sVar64;
                sVar64 = auVar41._2_2_;
                auVar55._2_2_ =
                     (ushort)(sVar7 < sVar64) * sVar64 | (ushort)(sVar7 >= sVar64) * sVar7;
                sVar7 = auVar41._4_2_;
                auVar55._4_2_ =
                     (ushort)(sVar66 < sVar7) * sVar7 | (ushort)(sVar66 >= sVar7) * sVar66;
                sVar7 = auVar41._6_2_;
                auVar55._6_2_ = (ushort)(sVar1 < sVar7) * sVar7 | (ushort)(sVar1 >= sVar7) * sVar1;
                sVar7 = auVar41._8_2_;
                auVar55._8_2_ = (ushort)(sVar2 < sVar7) * sVar7 | (ushort)(sVar2 >= sVar7) * sVar2;
                sVar7 = auVar41._10_2_;
                auVar55._10_2_ = (ushort)(sVar3 < sVar7) * sVar7 | (ushort)(sVar3 >= sVar7) * sVar3;
                sVar7 = auVar41._12_2_;
                auVar55._12_2_ = (ushort)(sVar4 < sVar7) * sVar7 | (ushort)(sVar4 >= sVar7) * sVar4;
                sVar7 = auVar41._14_2_;
                auVar55._14_2_ = (ushort)(sVar5 < sVar7) * sVar7 | (ushort)(sVar5 >= sVar7) * sVar5;
                sVar37 = in_XMM10._0_2_;
                auVar54._0_2_ = -(ushort)(sVar37 == -1);
                sVar44 = in_XMM10._2_2_;
                auVar54._2_2_ = -(ushort)(sVar44 == -1);
                sVar45 = in_XMM10._4_2_;
                auVar54._4_2_ = -(ushort)(sVar45 == -1);
                sVar46 = in_XMM10._6_2_;
                auVar54._6_2_ = -(ushort)(sVar46 == -1);
                sVar47 = in_XMM10._8_2_;
                auVar54._8_2_ = -(ushort)(sVar47 == -1);
                sVar48 = in_XMM10._10_2_;
                auVar54._10_2_ = -(ushort)(sVar48 == -1);
                sVar49 = in_XMM10._12_2_;
                sVar50 = in_XMM10._14_2_;
                auVar54._12_2_ = -(ushort)(sVar49 == -1);
                auVar54._14_2_ = -(ushort)(sVar50 == -1);
                auVar71 = ~auVar54 & auVar55;
                auVar72._4_2_ = local_c8;
                auVar72._0_4_ = uVar38;
                auVar72._6_2_ = sStack_c6;
                auVar72._8_2_ = local_c8;
                auVar72._10_2_ = sStack_c6;
                auVar72._12_2_ = local_c8;
                auVar72._14_2_ = sStack_c6;
                auVar75 = pblendvb(auVar76,auVar72,auVar54);
                auVar41 = pblendvb(auVar65,auVar72,auVar54);
                sVar7 = auVar71._0_2_;
                sVar64 = auVar71._2_2_;
                sVar5 = auVar71._14_2_;
                sVar66 = auVar71._4_2_;
                sVar1 = auVar71._6_2_;
                sVar2 = auVar71._8_2_;
                sVar3 = auVar71._10_2_;
                sVar4 = auVar71._12_2_;
                if (7 < uVar26) {
                  bVar8 = sVar7 < (short)local_e8;
                  uVar53 = (ushort)!bVar8 * (short)local_e8;
                  bVar9 = sVar64 < local_e8._2_2_;
                  uVar57 = (ushort)!bVar9 * local_e8._2_2_;
                  bVar10 = sVar66 < local_e8._4_2_;
                  uVar58 = (ushort)!bVar10 * local_e8._4_2_;
                  bVar11 = sVar2 < (short)uStack_e0;
                  uVar59 = (ushort)!bVar11 * (short)uStack_e0;
                  bVar12 = sVar3 < uStack_e0._2_2_;
                  uVar60 = (ushort)!bVar12 * uStack_e0._2_2_;
                  bVar13 = sVar4 < uStack_e0._4_2_;
                  uVar61 = (ushort)!bVar13 * uStack_e0._4_2_;
                  local_e8 = CONCAT26((ushort)(sVar1 < local_e8._6_2_) * sVar1 |
                                      (ushort)(sVar1 >= local_e8._6_2_) * local_e8._6_2_,
                                      CONCAT24((ushort)bVar10 * sVar66 | uVar58,
                                               CONCAT22((ushort)bVar9 * sVar64 | uVar57,
                                                        (ushort)bVar8 * sVar7 | uVar53)));
                  uStack_e0 = CONCAT26((ushort)(sVar5 < uStack_e0._6_2_) * sVar5 |
                                       (ushort)(sVar5 >= uStack_e0._6_2_) * uStack_e0._6_2_,
                                       CONCAT24((ushort)bVar13 * sVar4 | uVar61,
                                                CONCAT22((ushort)bVar12 * sVar3 | uVar60,
                                                         (ushort)bVar11 * sVar2 | uVar59)));
                  local_d8._2_2_ =
                       (ushort)((short)local_d8._2_2_ < sVar64) * sVar64 |
                       (ushort)((short)local_d8._2_2_ >= sVar64) * local_d8._2_2_;
                  local_d8._0_2_ =
                       (ushort)((short)local_d8._0_2_ < sVar7) * sVar7 |
                       (ushort)((short)local_d8._0_2_ >= sVar7) * local_d8._0_2_;
                  local_d8._4_2_ =
                       (ushort)((short)local_d8._4_2_ < sVar66) * sVar66 |
                       (ushort)((short)local_d8._4_2_ >= sVar66) * local_d8._4_2_;
                  local_d8._6_2_ =
                       (ushort)((short)local_d8._6_2_ < sVar1) * sVar1 |
                       (ushort)((short)local_d8._6_2_ >= sVar1) * local_d8._6_2_;
                  local_d8._8_2_ =
                       (ushort)((short)local_d8._8_2_ < sVar2) * sVar2 |
                       (ushort)((short)local_d8._8_2_ >= sVar2) * local_d8._8_2_;
                  local_d8._10_2_ =
                       (ushort)((short)local_d8._10_2_ < sVar3) * sVar3 |
                       (ushort)((short)local_d8._10_2_ >= sVar3) * local_d8._10_2_;
                  local_d8._12_2_ =
                       (ushort)((short)local_d8._12_2_ < sVar4) * sVar4 |
                       (ushort)((short)local_d8._12_2_ >= sVar4) * local_d8._12_2_;
                  local_d8._14_2_ =
                       (ushort)((short)local_d8._14_2_ < sVar5) * sVar5 |
                       (ushort)((short)local_d8._14_2_ >= sVar5) * local_d8._14_2_;
                }
                local_a8._0_2_ = auVar42._0_2_;
                local_a8._2_2_ = auVar42._2_2_;
                auVar43._0_2_ = -(ushort)(sVar37 < (short)local_a8);
                auVar43._2_2_ = -(ushort)(sVar44 < local_a8._2_2_);
                auVar43._4_2_ = -(ushort)(sVar45 < (short)local_a8);
                auVar43._6_2_ = -(ushort)(sVar46 < local_a8._2_2_);
                auVar43._8_2_ = -(ushort)(sVar47 < (short)local_a8);
                auVar43._10_2_ = -(ushort)(sVar48 < local_a8._2_2_);
                auVar43._12_2_ = -(ushort)(sVar49 < (short)local_a8);
                auVar43._14_2_ = -(ushort)(sVar50 < local_a8._2_2_);
                auVar72 = psraw(in_XMM10,0xf);
                auVar73 = ~auVar72 & auVar43 & auVar67;
                auVar69._0_2_ = -(ushort)(sVar7 == local_78._0_2_);
                auVar69._2_2_ = -(ushort)(sVar64 == local_78._2_2_);
                auVar69._4_2_ = -(ushort)(sVar66 == local_78._4_2_);
                auVar69._6_2_ = -(ushort)(sVar1 == local_78._6_2_);
                auVar69._8_2_ = -(ushort)(sVar2 == local_78._8_2_);
                auVar69._10_2_ = -(ushort)(sVar3 == local_78._10_2_);
                auVar69._12_2_ = -(ushort)(sVar4 == local_78._12_2_);
                auVar69._14_2_ = -(ushort)(sVar5 == local_78._14_2_);
                auVar70._0_2_ = -(ushort)(local_78._0_2_ < sVar7);
                auVar70._2_2_ = -(ushort)(local_78._2_2_ < sVar64);
                auVar70._4_2_ = -(ushort)(local_78._4_2_ < sVar66);
                auVar70._6_2_ = -(ushort)(local_78._6_2_ < sVar1);
                auVar70._8_2_ = -(ushort)(local_78._8_2_ < sVar2);
                auVar70._10_2_ = -(ushort)(local_78._10_2_ < sVar3);
                auVar70._12_2_ = -(ushort)(local_78._12_2_ < sVar4);
                auVar70._14_2_ = -(ushort)(local_78._14_2_ < sVar5);
                local_78 = pblendvb(local_78,auVar55,auVar70 & auVar73);
                auVar56._0_2_ = -(ushort)(sVar37 < local_b8._0_2_);
                auVar56._2_2_ = -(ushort)(sVar44 < local_b8._2_2_);
                auVar56._4_2_ = -(ushort)(sVar45 < local_b8._4_2_);
                auVar56._6_2_ = -(ushort)(sVar46 < local_b8._6_2_);
                auVar56._8_2_ = -(ushort)(sVar47 < local_b8._8_2_);
                auVar56._10_2_ = -(ushort)(sVar48 < local_b8._10_2_);
                auVar56._12_2_ = -(ushort)(sVar49 < local_b8._12_2_);
                auVar56._14_2_ = -(ushort)(sVar50 < local_b8._14_2_);
                auVar72 = pblendvb(auVar70 & auVar73,auVar73,auVar56 & auVar69);
                local_88 = pblendvb(local_88,local_118,auVar72);
                local_b8 = pblendvb(local_b8,in_XMM10,(auVar56 & auVar69 | auVar70) & auVar73);
                ptr_00[uVar26] = sVar7;
                ptr_01[uVar26] = auVar75._0_2_;
                in_XMM10 = paddsw(in_XMM10,_DAT_008a1ba0);
                auVar72 = auVar68;
              }
              local_118 = paddsw(local_118,_DAT_008a1bb0);
            }
            iVar29 = 0;
            iVar17 = 0;
            for (lVar19 = 0; uVar53 = (ushort)uVar28, (int)lVar19 != 8; lVar19 = lVar19 + 1) {
              uVar57 = *(ushort *)(local_78 + lVar19 * 2);
              if ((short)uVar53 < (short)uVar57) {
                iVar17 = (int)*(short *)(local_88 + lVar19 * 2);
                iVar29 = (int)*(short *)(local_b8 + lVar19 * 2);
                uVar28 = (uint)uVar57;
              }
              else if (uVar57 == uVar53) {
                iVar33 = (int)*(short *)(local_b8 + lVar19 * 2);
                if (iVar33 < iVar29) {
                  iVar17 = (int)*(short *)(local_88 + lVar19 * 2);
                  iVar29 = iVar33;
                }
                else if ((iVar29 == iVar33) && (*(short *)(local_88 + lVar19 * 2) <= iVar17)) {
                  iVar17 = (int)*(short *)(local_88 + lVar19 * 2);
                }
              }
            }
            auVar42._0_2_ = -(ushort)((short)local_e8 < local_c8);
            auVar42._2_2_ = -(ushort)(local_e8._2_2_ < sStack_c6);
            auVar42._4_2_ = -(ushort)(local_e8._4_2_ < local_c8);
            auVar42._6_2_ = -(ushort)(local_e8._6_2_ < sStack_c6);
            auVar42._8_2_ = -(ushort)((short)uStack_e0 < local_c8);
            auVar42._10_2_ = -(ushort)(uStack_e0._2_2_ < sStack_c6);
            auVar42._12_2_ = -(ushort)(uStack_e0._4_2_ < local_c8);
            auVar42._14_2_ = -(ushort)(uStack_e0._6_2_ < sStack_c6);
            auVar52._0_2_ = -(ushort)(local_68 < (short)local_d8._0_2_);
            auVar52._2_2_ = -(ushort)(sStack_66 < (short)local_d8._2_2_);
            auVar52._4_2_ = -(ushort)(local_68 < (short)local_d8._4_2_);
            auVar52._6_2_ = -(ushort)(sStack_66 < (short)local_d8._6_2_);
            auVar52._8_2_ = -(ushort)(local_68 < (short)local_d8._8_2_);
            auVar52._10_2_ = -(ushort)(sStack_66 < (short)local_d8._10_2_);
            auVar52._12_2_ = -(ushort)(local_68 < (short)local_d8._12_2_);
            auVar52._14_2_ = -(ushort)(sStack_66 < (short)local_d8._14_2_);
            auVar52 = auVar52 | auVar42;
            if ((((((((((((((((auVar52 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar52 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar52 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar52 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar52 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar52 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar52 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar52 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar52 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar52 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar52 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar52 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar52[0xf] < '\0') {
              *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
              uVar53 = 0;
              iVar29 = 0;
              iVar17 = 0;
            }
            ppVar18->score = (int)(short)uVar53;
            ppVar18->end_query = iVar17;
            ppVar18->end_ref = iVar29;
            local_a8 = uVar14;
            sStack_64 = local_68;
            sStack_62 = sStack_66;
            sStack_60 = local_68;
            sStack_5e = sStack_66;
            sStack_5c = local_68;
            sStack_5a = sStack_66;
            local_58 = uVar15;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_120);
              return ppVar18;
            }
            return ppVar18;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar22 = "_s1";
      }
      else {
        if (0 < _s1Len) goto LAB_0061fd68;
        __format = "%s: %s must be > 0\n";
        pcVar22 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_diag_sse41_128_16",pcVar22);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vJLimit = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            vWH = _mm_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi16(vJ, vNegOne),
                        _mm_cmplt_epi16(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi16(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi16(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi16(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}